

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O1

deUint32 glu::chooseDepthStencilFormat(RenderConfig *config)

{
  deUint32 internalFormat;
  bool bVar1;
  int iVar2;
  int iVar3;
  TextureFormat in_RAX;
  deUint32 unaff_EBX;
  long lVar4;
  TextureFormat combinedFormat;
  TextureFormat local_38;
  
  lVar4 = 0;
  local_38 = in_RAX;
  while( true ) {
    internalFormat = *(deUint32 *)((long)chooseDepthStencilFormat::s_formats + lVar4);
    local_38 = mapGLInternalFormat(internalFormat);
    iVar2 = getNumDepthBits(&local_38);
    iVar3 = getNumStencilBits(&local_38);
    if (((config->depthBits == -1) || (bVar1 = true, config->depthBits == iVar2)) &&
       (iVar2 = config->stencilBits, bVar1 = iVar2 != iVar3 && iVar2 != -1,
       iVar2 == iVar3 || iVar2 == -1)) {
      unaff_EBX = internalFormat;
    }
    if (!bVar1) break;
    lVar4 = lVar4 + 4;
    if (lVar4 == 0x18) {
      return 0;
    }
  }
  return unaff_EBX;
}

Assistant:

deUint32 chooseDepthStencilFormat (const glu::RenderConfig& config)
{
	static const deUint32 s_formats[] =
	{
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_STENCIL_INDEX8
	};

	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(s_formats); fmtNdx++)
	{
		const deUint32				format			= s_formats[fmtNdx];
		const tcu::TextureFormat	combinedFormat	= glu::mapGLInternalFormat(format);
		const int					depthBits		= getNumDepthBits(combinedFormat);
		const int					stencilBits		= getNumStencilBits(combinedFormat);

		if (config.depthBits != glu::RenderConfig::DONT_CARE &&
			config.depthBits != depthBits)
			continue;

		if (config.stencilBits != glu::RenderConfig::DONT_CARE &&
			config.stencilBits != stencilBits)
			continue;

		return format;
	}

	return 0;
}